

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void decode_and_encode_c1_longExample_producesSameResult(void)

{
  bech32_error bVar1;
  int iVar2;
  bech32_DecodedResult *decodedResult;
  bech32_bstring *bstring;
  char bstr [46];
  
  builtin_strncpy(bstr + 0x20,"e6mua7lmqqqxw",0xe);
  builtin_strncpy(bstr + 0x10,"f2tvdw0s3jn54khc",0x10);
  builtin_strncpy(bstr,"abcdef1qpzry9x8g",0x10);
  decodedResult = bech32_create_DecodedResult(bstr);
  bVar1 = bech32_decode(decodedResult,bstr);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1d4,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  iVar2 = strcmp(decodedResult->hrp,"abcdef");
  if (iVar2 != 0) {
    __assert_fail("strcmp(decodedResult->hrp, expectedHrp) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1d5,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  if (decodedResult->dplen != 0x20) {
    __assert_fail("decodedResult->dplen == expectedDpSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1d6,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  if (decodedResult->encoding == ENCODING_BECH32) {
    bstring = bech32_create_bstring(decodedResult->hrplen,0x20);
    bVar1 = bech32_encode_using_original_constant
                      (bstring,decodedResult->hrp,decodedResult->dp,decodedResult->dplen);
    if (bVar1 != E_BECH32_SUCCESS) {
      __assert_fail("bech32_encode_using_original_constant(bstring, decodedResult->hrp, decodedResult->dp, decodedResult->dplen) == E_BECH32_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                    ,0x1db,"void decode_and_encode_c1_longExample_producesSameResult(void)");
    }
    iVar2 = strcmp(bstr,bstring->string);
    if (iVar2 == 0) {
      bech32_free_DecodedResult(decodedResult);
      bech32_free_bstring(bstring);
      return;
    }
    __assert_fail("strcmp(bstr, bstring->string) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1dc,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  __assert_fail("ENCODING_BECH32 == decodedResult->encoding",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x1d7,"void decode_and_encode_c1_longExample_producesSameResult(void)");
}

Assistant:

void decode_and_encode_c1_longExample_producesSameResult(void) {
    char bstr[] = "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw";
    char expectedHrp[] = "abcdef";
    const size_t expectedDpSize = 32; // 32 = num chars after '1', minus 6 for checksum chars

    bech32_DecodedResult * decodedResult = bech32_create_DecodedResult(bstr);

    assert(bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS);
    assert(strcmp(decodedResult->hrp, expectedHrp) == 0);
    assert(decodedResult->dplen == expectedDpSize);
    assert(ENCODING_BECH32 == decodedResult->encoding);

    bech32_bstring *bstring = bech32_create_bstring(decodedResult->hrplen, decodedResult->dplen);

    assert(bech32_encode_using_original_constant(bstring, decodedResult->hrp, decodedResult->dp, decodedResult->dplen) == E_BECH32_SUCCESS);
    assert(strcmp(bstr, bstring->string) == 0);

    bech32_free_DecodedResult(decodedResult);
    bech32_free_bstring(bstring);
}